

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  *containsNewLineResult = false;
  pcVar3 = this->end_;
  pcVar4 = this->current_;
  do {
    while( true ) {
      pcVar1 = pcVar4 + 1;
      if (pcVar3 <= pcVar1) goto LAB_00558aab;
      this->current_ = pcVar1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar1;
      if (cVar2 != '\n') break;
      *containsNewLineResult = true;
    }
  } while ((cVar2 != '*') || (*pcVar1 != '/'));
LAB_00558aab:
  if (pcVar4 == pcVar3) {
    return false;
  }
  this->current_ = pcVar4 + 1;
  return *pcVar4 == '/';
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}